

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O0

void __thiscall DStrifeStatusBar::DrawPopScreen(DStrifeStatusBar *this,int bottom)

{
  APlayerPawn *pAVar1;
  FFont *font;
  DFrameBuffer *pDVar2;
  bool bVar3;
  int iVar4;
  int y;
  FTexture *pFVar5;
  char *string;
  AActor *pAVar6;
  FName local_d4;
  PClassActor *local_d0;
  PClassActor *ammotype;
  FName local_c0;
  int local_bc;
  int local_b8;
  uint local_b4;
  int rownum;
  int colnum;
  int scroll;
  int clipright;
  int clipleft;
  int leftcol;
  int endpos;
  int pos;
  FBrokenLines *lines;
  int seconds;
  int height;
  int back;
  int bars;
  int top;
  int left;
  int yscale;
  int xscale;
  AInventory *item;
  char *pcStack_60;
  int i;
  char *label;
  char buff [64];
  int bottom_local;
  DStrifeStatusBar *this_local;
  
  height = this->CurrentPop == 3 ^ 5;
  seconds = this->CurrentPop == 3 ^ 7;
  buff._60_4_ = bottom;
  lines._4_4_ = clamp<int>(this->PopHeight + (int)(r_TicFracF * (double)this->PopHeightChange),-0x68
                           ,0);
  left = CleanXfac;
  top = CleanYfac;
  iVar4 = DCanvas::GetWidth((DCanvas *)screen);
  pDVar2 = screen;
  bars = iVar4 / 2 + CleanXfac * -0xa0;
  back = buff._60_4_ + lines._4_4_ * top;
  pFVar5 = FImageCollection::operator[](&this->Images,seconds);
  DCanvas::DrawTexture
            ((DCanvas *)pDVar2,pFVar5,(double)bars,(double)back,0x40001393,0x3fe8000000000000,1,
             0x4000138c,0);
  pDVar2 = screen;
  pFVar5 = FImageCollection::operator[](&this->Images,height);
  DCanvas::DrawTexture((DCanvas *)pDVar2,pFVar5,(double)bars,(double)back,0x40001393,1,0);
  iVar4 = this->CurrentPop;
  if (iVar4 == 1) {
    lines._0_4_ = Tics2Seconds(::level.time);
    mysnprintf((char *)&label,0x40,"%02d:%02d:%02d",(long)(int)lines / 0xe10 & 0xffffffff,
               (long)((ulong)(uint)((int)((long)(int)lines % 0xe10) >> 0x1f) << 0x20 |
                     (long)(int)lines % 0xe10 & 0xffffffffU) / 0x3c & 0xffffffff,
               (long)(int)lines % 0x3c & 0xffffffff);
    DCanvas::DrawText((DCanvas *)screen,SmallFont2,0xb,bars + left * 0xd2,back + top * 8,
                      (char *)&label,0x40001393,1,0);
    bVar3 = FString::IsNotEmpty(&((this->super_DBaseStatusBar).CPlayer)->LogText);
    if (bVar3) {
      _endpos = V_BreakLines(SmallFont2,0x110,&((this->super_DBaseStatusBar).CPlayer)->LogText,false
                            );
      item._4_4_ = 0;
      while (pDVar2 = screen, font = SmallFont2, -1 < _endpos[item._4_4_].Width) {
        iVar4 = bars + left * 0x18;
        y = back + (item._4_4_ * 0xc + 0x12) * top;
        string = FString::operator_cast_to_char_(&_endpos[item._4_4_].Text);
        DCanvas::DrawText((DCanvas *)pDVar2,font,0xb,iVar4,y,string,0x40001393,1,0);
        item._4_4_ = item._4_4_ + 1;
      }
      V_FreeBrokenLines(_endpos);
    }
  }
  else if (iVar4 == 2) {
    leftcol = this->KeyPopPos;
    clipleft = leftcol + 10;
    clipright = 0x14;
    scroll = bars + left * 0x11;
    colnum = bars + left * 0x12f;
    if (0 < this->KeyPopScroll) {
      rownum = MAX<int>(0,this->KeyPopScroll - (int)(r_TicFracF * 25.454545454545453));
      leftcol = leftcol + -10;
      clipright = clipright + -0x118 + rownum;
    }
    item._4_4_ = 0;
    for (_yscale = ::TObjPtr::operator_cast_to_AInventory_
                             ((TObjPtr *)
                              &(((this->super_DBaseStatusBar).CPlayer)->mo->super_AActor).Inventory)
        ; item._4_4_ < clipleft && _yscale != (AInventory *)0x0;
        _yscale = ::TObjPtr::operator_cast_to_AInventory_
                            ((TObjPtr *)&(_yscale->super_AActor).Inventory)) {
      bVar3 = DObject::IsKindOf((DObject *)_yscale,AKey::RegistrationInfo.MyClass);
      if (bVar3) {
        if (item._4_4_ < leftcol) {
          item._4_4_ = item._4_4_ + 1;
        }
        else {
          pcStack_60 = AActor::GetTag(&_yscale->super_AActor,(char *)0x0);
          pDVar2 = screen;
          local_b4 = 1;
          if (0 < this->KeyPopScroll) {
            local_b4 = 3;
          }
          local_b4 = (item._4_4_ - leftcol) / 5 & local_b4;
          local_b8 = (item._4_4_ % 5) * 0x12;
          local_bc = (_yscale->Icon).texnum;
          pFVar5 = FTextureManager::operator()(&TexMan,(FTextureID)local_bc,false);
          DCanvas::DrawTexture
                    ((DCanvas *)pDVar2,pFVar5,
                     (double)(int)(bars + (local_b4 * 0x8c + clipright) * left),
                     (double)(back + (local_b8 + 6) * top),0x40001393,1,0x400013a3,
                     (ulong)(uint)scroll,0x400013a4,colnum,0);
          DCanvas::DrawText((DCanvas *)screen,SmallFont2,0xb,
                            bars + (local_b4 * 0x8c + clipright + 0x11) * left,
                            back + (local_b8 + 0xb) * top,pcStack_60,0x40001393,1,0x400013a3,scroll,
                            0x400013a4,colnum,0);
          item._4_4_ = item._4_4_ + 1;
        }
      }
    }
  }
  else if (iVar4 == 3) {
    DrINumber2(this,(((this->super_DBaseStatusBar).CPlayer)->mo->super_AActor).accuracy,
               bars + left * 0x10c,back + top * 0x1c,left * 7,0x13);
    DrINumber2(this,(((this->super_DBaseStatusBar).CPlayer)->mo->super_AActor).stamina,
               bars + left * 0x10c,back + top * 0x34,left * 7,0x13);
    item._4_4_ = 0;
    for (_yscale = ::TObjPtr::operator_cast_to_AInventory_
                             ((TObjPtr *)
                              &(((this->super_DBaseStatusBar).CPlayer)->mo->super_AActor).Inventory)
        ; _yscale != (AInventory *)0x0;
        _yscale = ::TObjPtr::operator_cast_to_AInventory_
                            ((TObjPtr *)&(_yscale->super_AActor).Inventory)) {
      bVar3 = DObject::IsKindOf((DObject *)_yscale,AKey::RegistrationInfo.MyClass);
      if (bVar3) {
        item._4_4_ = item._4_4_ + 1;
      }
    }
    DrINumber2(this,item._4_4_,bars + left * 0x10c,back + top * 0x4c,left * 7,0x13);
    pAVar1 = ((this->super_DBaseStatusBar).CPlayer)->mo;
    FName::FName(&local_c0,NAME_Communicator);
    _yscale = AActor::FindInventory(&pAVar1->super_AActor,&local_c0);
    pDVar2 = screen;
    if (_yscale != (AInventory *)0x0) {
      ammotype._4_4_ = (_yscale->Icon).texnum;
      pFVar5 = FTextureManager::operator()(&TexMan,ammotype._4_4_,false);
      DCanvas::DrawTexture
                ((DCanvas *)pDVar2,pFVar5,(double)(bars + left * 0x118),(double)(back + top * 0x4a),
                 0x40001393,1,0);
    }
    for (item._4_4_ = 0; item._4_4_ < 7; item._4_4_ = item._4_4_ + 1) {
      local_d0 = PClass::FindActor(DrawPopScreen::AmmoList[item._4_4_].AmmoType);
      _yscale = AActor::FindInventory
                          (&((this->super_DBaseStatusBar).CPlayer)->mo->super_AActor,local_d0,false)
      ;
      if (_yscale == (AInventory *)0x0) {
        DrINumber2(this,0,bars + left * 0xce,back + DrawPopScreen::AmmoList[item._4_4_].Y * top,
                   left * 7,0x13);
        pAVar6 = GetDefaultByType(&local_d0->super_PClass);
        DrINumber2(this,*(int *)((long)&pAVar6[1].super_DThinker.super_DObject.Class + 4),
                   bars + left * 0xef,back + DrawPopScreen::AmmoList[item._4_4_].Y * top,left * 7,
                   0x13);
      }
      else {
        DrINumber2(this,_yscale->Amount,bars + left * 0xce,
                   back + DrawPopScreen::AmmoList[item._4_4_].Y * top,left * 7,0x13);
        DrINumber2(this,_yscale->MaxAmount,bars + left * 0xef,
                   back + DrawPopScreen::AmmoList[item._4_4_].Y * top,left * 7,0x13);
      }
    }
    for (item._4_4_ = 0; item._4_4_ < 6; item._4_4_ = item._4_4_ + 1) {
      pAVar1 = ((this->super_DBaseStatusBar).CPlayer)->mo;
      FName::FName(&local_d4,DrawPopScreen::WeaponList[item._4_4_].TypeName);
      _yscale = AActor::FindInventory(&pAVar1->super_AActor,&local_d4);
      pDVar2 = screen;
      if (_yscale != (AInventory *)0x0) {
        pFVar5 = FTextureManager::operator()(&TexMan,(FTextureID)(_yscale->Icon).texnum,false);
        DCanvas::DrawTexture
                  ((DCanvas *)pDVar2,pFVar5,
                   (double)(bars + DrawPopScreen::WeaponList[item._4_4_].X * left),
                   (double)(back + DrawPopScreen::WeaponList[item._4_4_].Y * top),0x40001393,1,
                   0x4000139c,0,0x4000139b,0,0);
      }
    }
  }
  return;
}

Assistant:

void DrawPopScreen (int bottom)
	{
		char buff[64];
		const char *label;
		int i;
		AInventory *item;
		int xscale, yscale, left, top;
		int bars = (CurrentPop == POP_Status) ? imgINVPOP : imgINVPOP2;
		int back = (CurrentPop == POP_Status) ? imgINVPBAK : imgINVPBAK2;
		// Extrapolate the height of the popscreen for smoother movement
		int height = clamp<int> (PopHeight + int(r_TicFracF * PopHeightChange), -POP_HEIGHT, 0);

		xscale = CleanXfac;
		yscale = CleanYfac;
		left = screen->GetWidth()/2 - 160*CleanXfac;
		top = bottom + height * yscale;

		screen->DrawTexture (Images[back], left, top, DTA_CleanNoMove, true, DTA_AlphaF, 0.75, TAG_DONE);
		screen->DrawTexture (Images[bars], left, top, DTA_CleanNoMove, true, TAG_DONE);


		switch (CurrentPop)
		{
		case POP_Log:
		{
			int seconds = Tics2Seconds(level.time);
			// Draw the latest log message.
			mysnprintf(buff, countof(buff), "%02d:%02d:%02d",
				seconds / 3600,
				(seconds % 3600) / 60,
				(seconds) % 60);

			screen->DrawText(SmallFont2, CR_UNTRANSLATED, left + 210 * xscale, top + 8 * yscale, buff,
				DTA_CleanNoMove, true, TAG_DONE);

			if (CPlayer->LogText.IsNotEmpty())
			{
				FBrokenLines *lines = V_BreakLines(SmallFont2, 272, CPlayer->LogText);
				for (i = 0; lines[i].Width >= 0; ++i)
				{
					screen->DrawText(SmallFont2, CR_UNTRANSLATED, left + 24 * xscale, top + (18 + i * 12)*yscale,
						lines[i].Text, DTA_CleanNoMove, true, TAG_DONE);
				}
				V_FreeBrokenLines(lines);
			}
			break;
		}

		case POP_Keys:
			// List the keys the player has.
			int pos, endpos, leftcol;
			int clipleft, clipright;
			
			pos = KeyPopPos;
			endpos = pos + 10;
			leftcol = 20;
			clipleft = left + 17*xscale;
			clipright = left + (320-17)*xscale;
			if (KeyPopScroll > 0)
			{
				// Extrapolate the scroll position for smoother scrolling
				int scroll = MAX<int> (0,KeyPopScroll - int(r_TicFracF * (280./KEY_TIME)));
				pos -= 10;
				leftcol = leftcol - 280 + scroll;
			}
			for (i = 0, item = CPlayer->mo->Inventory;
				i < endpos && item != NULL;
				item = item->Inventory)
			{
				if (!item->IsKindOf (RUNTIME_CLASS(AKey)))
					continue;
				
				if (i < pos)
				{
					i++;
					continue;
				}

				label = item->GetTag();

				int colnum = ((i-pos) / 5) & (KeyPopScroll > 0 ? 3 : 1);
				int rownum = (i % 5) * 18;

				screen->DrawTexture (TexMan(item->Icon),
					left + (colnum * 140 + leftcol)*xscale,
					top + (6 + rownum)*yscale,
					DTA_CleanNoMove, true,
					DTA_ClipLeft, clipleft,
					DTA_ClipRight, clipright,
					TAG_DONE);
				screen->DrawText (SmallFont2, CR_UNTRANSLATED,
					left + (colnum * 140 + leftcol + 17)*xscale,
					top + (11 + rownum)*yscale,
					label,
					DTA_CleanNoMove, true,
					DTA_ClipLeft, clipleft,
					DTA_ClipRight, clipright,
					TAG_DONE);
				i++;
			}
			break;

		case POP_Status:
			// Show miscellaneous status items.
			
			// Print stats
			DrINumber2 (CPlayer->mo->accuracy, left+268*xscale, top+28*yscale, 7*xscale, imgFONY0);
			DrINumber2 (CPlayer->mo->stamina, left+268*xscale, top+52*yscale, 7*xscale, imgFONY0);

			// How many keys does the player have?
			for (i = 0, item = CPlayer->mo->Inventory;
				item != NULL;
				item = item->Inventory)
			{
				if (item->IsKindOf (RUNTIME_CLASS(AKey)))
				{
					i++;
				}
			}
			DrINumber2 (i, left+268*xscale, top+76*yscale, 7*xscale, imgFONY0);

			// Does the player have a communicator?
			item = CPlayer->mo->FindInventory (NAME_Communicator);
			if (item != NULL)
			{
				screen->DrawTexture (TexMan(item->Icon),
					left + 280*xscale,
					top + 74*yscale,
					DTA_CleanNoMove, true, TAG_DONE);
			}

			// How much ammo does the player have?
			static const struct
			{
				ENamedName AmmoType;
				int Y;
			} AmmoList[7] =
			{
				{ NAME_ClipOfBullets,			19 },
				{ NAME_PoisonBolts,				35 },
				{ NAME_ElectricBolts,			43 },
				{ NAME_HEGrenadeRounds,			59 },
				{ NAME_PhosphorusGrenadeRounds,	67 },
				{ NAME_MiniMissiles,			75 },
				{ NAME_EnergyPod,				83 }
			};
			for (i = 0; i < 7; ++i)
			{
				PClassActor *ammotype = PClass::FindActor(AmmoList[i].AmmoType);
				item = CPlayer->mo->FindInventory (ammotype);

				if (item == NULL)
				{
					DrINumber2 (0, left+206*xscale, top+AmmoList[i].Y*yscale, 7*xscale, imgFONY0);
					DrINumber2 (((AInventory *)GetDefaultByType (ammotype))->MaxAmount,
						left+239*xscale, top+AmmoList[i].Y*yscale, 7*xscale, imgFONY0);
				}
				else
				{
					DrINumber2 (item->Amount, left+206*xscale, top+AmmoList[i].Y*yscale, 7*xscale, imgFONY0);
					DrINumber2 (item->MaxAmount, left+239*xscale, top+AmmoList[i].Y*yscale, 7*xscale, imgFONY0);
				}
			}

			// What weapons does the player have?
			static const struct
			{
				ENamedName TypeName;
				int X, Y;
			} WeaponList[6] =
			{
				{ NAME_StrifeCrossbow,			23, 19 },
				{ NAME_AssaultGun,				21, 41 },
				{ NAME_FlameThrower,			57, 50 },
				{ NAME_MiniMissileLauncher,		20, 64 },
				{ NAME_StrifeGrenadeLauncher,	55, 20 },
				{ NAME_Mauler,					52, 75 },
			};
			for (i = 0; i < 6; ++i)
			{
				item = CPlayer->mo->FindInventory (WeaponList[i].TypeName);

				if (item != NULL)
				{
					screen->DrawTexture (TexMan(item->Icon),
						left + WeaponList[i].X*xscale,
						top + WeaponList[i].Y*yscale,
						DTA_CleanNoMove, true,
						DTA_LeftOffset, 0,
						DTA_TopOffset, 0,
						TAG_DONE);
				}
			}
			break;
		}
	}